

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * __thiscall CVmRun::do_return(CVmRun *this)

{
  vm_val_t *pvVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  
  pvVar1 = frame_ptr_;
  if ((frame_ptr_[-6].typ == VM_OBJ) &&
     (iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[frame_ptr_[-6].val.obj >> 0xc]
                                     [frame_ptr_[-6].val.obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[frame_ptr_[-6].val.obj >> 0xc] +
                         (frame_ptr_[-6].val.obj & 0xfff),CVmObjFrameRef::metaclass_reg_),
     iVar4 != 0)) {
    CVmObjFrameRef::inval_frame
              ((CVmObjFrameRef *)
               ((long)&G_obj_table_X.pages_[pvVar1[-6].val.obj >> 0xc]->ptr_ +
               (ulong)((pvVar1[-6].val.obj & 0xfff) * 0x18)));
  }
  pvVar1 = (vm_val_t *)frame_ptr_[-1].val.native_desc;
  puVar2 = (uchar *)frame_ptr_[-3].val.ptr;
  uVar5 = frame_ptr_[-4].val.obj;
  sp_ = frame_ptr_ + (-0xb - (long)frame_ptr_[-2].val.intval);
  frame_ptr_ = pvVar1;
  entry_ptr_native_ = puVar2;
  if (uVar5 < 10) {
    if (uVar5 == 0) {
      bVar3 = false;
    }
    else {
      if (uVar5 == 2) {
        pvVar1[sp_[-1].val.intval] = r0_;
        uVar5 = sp_[-2].val.obj;
        sp_ = sp_ + -2;
      }
      else {
        if (uVar5 != 1) {
          err_throw(0x8fd);
        }
        uVar5 = sp_[-1].val.obj;
        sp_[-1] = r0_;
      }
      bVar3 = true;
    }
    if (!bVar3) {
      return (uchar *)0x0;
    }
  }
  if (puVar2[uVar5] == 0x8b) {
    pvVar1 = sp_ + 1;
    *sp_ = r0_;
    sp_ = pvVar1;
    uVar5 = uVar5 + 1;
  }
  return puVar2 + uVar5;
}

Assistant:

const uchar *CVmRun::do_return(VMG0_)
{
    /* invalidate the frame reference object, if present */
    vm_val_t *fro = get_frameref_slot(vmg_ frame_ptr_);
    if (fro->typ == VM_OBJ
        && CVmObjFrameRef::is_frameref_obj(vmg_ fro->val.obj))
        ((CVmObjFrameRef *)vm_objp(vmg_ fro->val.obj))->inval_frame(vmg0_);

    /*
     *   The frame pointer always points to the location on the stack
     *   where we pushed the enclosing frame pointer.  Reset the stack
     *   pointer to the current frame pointer, then pop the enclosing
     *   frame pointer.  
     */
    set_sp(frame_ptr_);
    frame_ptr_ = (vm_val_t *)get(0)->val.ptr;

    /* get the enclosing argument count */
    int argc = get(1)->val.intval;

    /* restore the enclosing entry pointer */
    entry_ptr_native_ = (const uchar *)get(2)->val.ptr;

    /* restore the enclosing code offset */
    pool_ofs_t caller_ofs = get(3)->val.ofs;

    /* 
     *   Discard the actual parameters, plus the 'self', defining object,
     *   original target object, and target property values.  While we're at
     *   it, also discard the enclosing frame pointer, enclosing argument
     *   count, enclosing entry pointer, and enclosing code offset, which
     *   we've already restored.  
     */
    discard(argc + 11);

    /* leave the profiler stack level */
    VM_IF_PROFILER(if (profiling_)
        prof_leave());

    /* if we're debugging, notify the debugger of the return */
    VM_IF_DEBUGGER(G_debugger->step_return(vmg0_));

    /* 
     *   if this is a special return address code, execute the appropraite
     *   local subroutine 
     */
    if (vmrun_is_special_return(caller_ofs))
    {
        vm_val_t v;
        
        switch (caller_ofs)
        {
        case VMRUN_RET_RECURSIVE:
            /* 
             *   return from recursive VM invocation - just return 0 as the
             *   finishing offset to tell the caller to exit the bytecode
             *   execution loop 
             */
            return 0;

        case VMRUN_RET_OP:
            /* 
             *   returning from operator evaluation - push R0 as the operand
             *   result, and return to the address currently at TOS 
             */
            caller_ofs = get(0)->val.intval;
            *get(0) = r0_;
            break;

        case VMRUN_RET_OP_ASILCL:
            /*
             *   Returning from an operator evaluation, with assignment to a
             *   local.  The local variable number is at TOS; assign it, then
             *   return to the address next on the stack. 
             */
            pop(&v);
            *get_local(vmg_ v.val.intval) = r0_;
            pop(&v);
            caller_ofs = v.val.intval;
            break;

        default:
            /* 
             *   invalid address; we're going to dump into random code if we
             *   continue, so nip it in the bud and throw an invalid op now 
             */
            err_throw(VMERR_INVALID_OPCODE);
        }
    }

    /*
     *   Empirically, about half the time, the caller will push the return
     *   value onto the stack.  It's a little faster to test for that case
     *   here and handle it specially.  
     */
    if (*(entry_ptr_native_ + caller_ofs) == OPC_GETR0)
    {
        push(&r0_);
        caller_ofs += 1;
    }

    /* 
     *   return the new program counter - calculate the PC offset by adding
     *   the offset within the method to the entry pointer 
     */
    return entry_ptr_native_ + caller_ofs;
}